

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 10_create_string.cpp
# Opt level: O3

char * create_by_char(char ch,int size)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar25;
  char *pcVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  char cVar30;
  int iVar41;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  long lVar42;
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar64;
  undefined1 auVar62 [16];
  int iVar65;
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar79;
  int iVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  long lVar45;
  
  uVar1 = size + 1;
  uVar25 = 0xffffffff;
  if (-2 < size) {
    uVar25 = uVar1;
  }
  pcVar26 = (char *)operator_new__((long)(int)uVar25);
  auVar24 = _DAT_00125910;
  if (-1 < size) {
    uVar27 = (ulong)(uint)size;
    lVar28 = (ulong)uVar1 - 1;
    auVar31._8_4_ = (int)lVar28;
    auVar31._0_8_ = lVar28;
    auVar31._12_4_ = (int)((ulong)lVar28 >> 0x20);
    uVar29 = 0xf;
    auVar32 = auVar31;
    auVar44 = _DAT_00125890;
    auVar46 = _DAT_001258a0;
    auVar47 = _DAT_001258b0;
    auVar48 = _DAT_001258c0;
    auVar49 = _DAT_001258d0;
    auVar50 = _DAT_001258e0;
    auVar51 = _DAT_001258f0;
    auVar52 = _DAT_00125900;
    do {
      auVar62 = auVar31 ^ auVar24;
      auVar66 = auVar52 ^ auVar24;
      iVar41 = auVar62._0_4_;
      iVar79 = -(uint)(iVar41 < auVar66._0_4_);
      iVar43 = auVar62._4_4_;
      auVar68._4_4_ = -(uint)(iVar43 < auVar66._4_4_);
      iVar64 = auVar62._8_4_;
      iVar83 = -(uint)(iVar64 < auVar66._8_4_);
      iVar65 = auVar62._12_4_;
      auVar68._12_4_ = -(uint)(iVar65 < auVar66._12_4_);
      auVar62._4_4_ = iVar79;
      auVar62._0_4_ = iVar79;
      auVar62._8_4_ = iVar83;
      auVar62._12_4_ = iVar83;
      auVar62 = pshuflw(auVar32,auVar62,0xe8);
      auVar67._4_4_ = -(uint)(auVar66._4_4_ == iVar43);
      auVar67._12_4_ = -(uint)(auVar66._12_4_ == iVar65);
      auVar67._0_4_ = auVar67._4_4_;
      auVar67._8_4_ = auVar67._12_4_;
      auVar53 = pshuflw(in_XMM11,auVar67,0xe8);
      auVar68._0_4_ = auVar68._4_4_;
      auVar68._8_4_ = auVar68._12_4_;
      auVar66 = pshuflw(auVar62,auVar68,0xe8);
      auVar32._8_4_ = 0xffffffff;
      auVar32._0_8_ = 0xffffffffffffffff;
      auVar32._12_4_ = 0xffffffff;
      auVar32 = (auVar66 | auVar53 & auVar62) ^ auVar32;
      auVar32 = packssdw(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        cVar30 = '\0';
        if (uVar29 - 0xf < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 0xf] = cVar30;
      }
      auVar53._4_4_ = iVar79;
      auVar53._0_4_ = iVar79;
      auVar53._8_4_ = iVar83;
      auVar53._12_4_ = iVar83;
      auVar68 = auVar67 & auVar53 | auVar68;
      auVar32 = packssdw(auVar68,auVar68);
      auVar66._8_4_ = 0xffffffff;
      auVar66._0_8_ = 0xffffffffffffffff;
      auVar66._12_4_ = 0xffffffff;
      auVar32 = packssdw(auVar32 ^ auVar66,auVar32 ^ auVar66);
      auVar32 = packsswb(auVar32,auVar32);
      if ((auVar32._0_4_ >> 8 & 1) != 0) {
        cVar30 = '\0';
        if (uVar29 - 0xe < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 0xe] = cVar30;
      }
      auVar32 = auVar51 ^ auVar24;
      auVar54._0_4_ = -(uint)(iVar41 < auVar32._0_4_);
      auVar54._4_4_ = -(uint)(iVar43 < auVar32._4_4_);
      auVar54._8_4_ = -(uint)(iVar64 < auVar32._8_4_);
      auVar54._12_4_ = -(uint)(iVar65 < auVar32._12_4_);
      auVar69._4_4_ = auVar54._0_4_;
      auVar69._0_4_ = auVar54._0_4_;
      auVar69._8_4_ = auVar54._8_4_;
      auVar69._12_4_ = auVar54._8_4_;
      iVar79 = -(uint)(auVar32._4_4_ == iVar43);
      iVar83 = -(uint)(auVar32._12_4_ == iVar65);
      auVar11._4_4_ = iVar79;
      auVar11._0_4_ = iVar79;
      auVar11._8_4_ = iVar83;
      auVar11._12_4_ = iVar83;
      auVar80._4_4_ = auVar54._4_4_;
      auVar80._0_4_ = auVar54._4_4_;
      auVar80._8_4_ = auVar54._12_4_;
      auVar80._12_4_ = auVar54._12_4_;
      auVar32 = auVar11 & auVar69 | auVar80;
      auVar32 = packssdw(auVar32,auVar32);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar32 = packssdw(auVar32 ^ auVar2,auVar32 ^ auVar2);
      auVar32 = packsswb(auVar32,auVar32);
      if ((auVar32._0_4_ >> 0x10 & 1) != 0) {
        cVar30 = '\0';
        if (uVar29 - 0xd < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 0xd] = cVar30;
      }
      auVar32 = pshufhw(auVar32,auVar69,0x84);
      auVar12._4_4_ = iVar79;
      auVar12._0_4_ = iVar79;
      auVar12._8_4_ = iVar83;
      auVar12._12_4_ = iVar83;
      auVar66 = pshufhw(auVar54,auVar12,0x84);
      auVar62 = pshufhw(auVar32,auVar80,0x84);
      auVar33._8_4_ = 0xffffffff;
      auVar33._0_8_ = 0xffffffffffffffff;
      auVar33._12_4_ = 0xffffffff;
      auVar33 = (auVar62 | auVar66 & auVar32) ^ auVar33;
      auVar32 = packssdw(auVar33,auVar33);
      auVar32 = packsswb(auVar32,auVar32);
      if ((auVar32._0_4_ >> 0x18 & 1) != 0) {
        cVar30 = '\0';
        if (uVar29 - 0xc < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 0xc] = cVar30;
      }
      auVar32 = auVar50 ^ auVar24;
      auVar55._0_4_ = -(uint)(iVar41 < auVar32._0_4_);
      auVar55._4_4_ = -(uint)(iVar43 < auVar32._4_4_);
      auVar55._8_4_ = -(uint)(iVar64 < auVar32._8_4_);
      auVar55._12_4_ = -(uint)(iVar65 < auVar32._12_4_);
      auVar13._4_4_ = auVar55._0_4_;
      auVar13._0_4_ = auVar55._0_4_;
      auVar13._8_4_ = auVar55._8_4_;
      auVar13._12_4_ = auVar55._8_4_;
      auVar66 = pshuflw(auVar80,auVar13,0xe8);
      auVar34._0_4_ = -(uint)(auVar32._0_4_ == iVar41);
      auVar34._4_4_ = -(uint)(auVar32._4_4_ == iVar43);
      auVar34._8_4_ = -(uint)(auVar32._8_4_ == iVar64);
      auVar34._12_4_ = -(uint)(auVar32._12_4_ == iVar65);
      auVar70._4_4_ = auVar34._4_4_;
      auVar70._0_4_ = auVar34._4_4_;
      auVar70._8_4_ = auVar34._12_4_;
      auVar70._12_4_ = auVar34._12_4_;
      auVar32 = pshuflw(auVar34,auVar70,0xe8);
      auVar71._4_4_ = auVar55._4_4_;
      auVar71._0_4_ = auVar55._4_4_;
      auVar71._8_4_ = auVar55._12_4_;
      auVar71._12_4_ = auVar55._12_4_;
      auVar62 = pshuflw(auVar55,auVar71,0xe8);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar32 = packssdw(auVar32 & auVar66,(auVar62 | auVar32 & auVar66) ^ auVar3);
      auVar32 = packsswb(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        cVar30 = '\0';
        if (uVar29 - 0xb < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 0xb] = cVar30;
      }
      auVar14._4_4_ = auVar55._0_4_;
      auVar14._0_4_ = auVar55._0_4_;
      auVar14._8_4_ = auVar55._8_4_;
      auVar14._12_4_ = auVar55._8_4_;
      auVar71 = auVar70 & auVar14 | auVar71;
      auVar62 = packssdw(auVar71,auVar71);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar32 = packssdw(auVar32,auVar62 ^ auVar4);
      auVar32 = packsswb(auVar32,auVar32);
      if ((auVar32._4_2_ >> 8 & 1) != 0) {
        cVar30 = '\0';
        if (uVar29 - 10 < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 10] = cVar30;
      }
      auVar32 = auVar49 ^ auVar24;
      auVar56._0_4_ = -(uint)(iVar41 < auVar32._0_4_);
      auVar56._4_4_ = -(uint)(iVar43 < auVar32._4_4_);
      auVar56._8_4_ = -(uint)(iVar64 < auVar32._8_4_);
      auVar56._12_4_ = -(uint)(iVar65 < auVar32._12_4_);
      auVar72._4_4_ = auVar56._0_4_;
      auVar72._0_4_ = auVar56._0_4_;
      auVar72._8_4_ = auVar56._8_4_;
      auVar72._12_4_ = auVar56._8_4_;
      iVar79 = -(uint)(auVar32._4_4_ == iVar43);
      iVar83 = -(uint)(auVar32._12_4_ == iVar65);
      auVar15._4_4_ = iVar79;
      auVar15._0_4_ = iVar79;
      auVar15._8_4_ = iVar83;
      auVar15._12_4_ = iVar83;
      auVar81._4_4_ = auVar56._4_4_;
      auVar81._0_4_ = auVar56._4_4_;
      auVar81._8_4_ = auVar56._12_4_;
      auVar81._12_4_ = auVar56._12_4_;
      auVar32 = auVar15 & auVar72 | auVar81;
      auVar32 = packssdw(auVar32,auVar32);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar32 = packssdw(auVar32 ^ auVar5,auVar32 ^ auVar5);
      auVar32 = packsswb(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        cVar30 = '\0';
        if (uVar29 - 9 < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 9] = cVar30;
      }
      auVar32 = pshufhw(auVar32,auVar72,0x84);
      auVar16._4_4_ = iVar79;
      auVar16._0_4_ = iVar79;
      auVar16._8_4_ = iVar83;
      auVar16._12_4_ = iVar83;
      auVar66 = pshufhw(auVar56,auVar16,0x84);
      auVar62 = pshufhw(auVar32,auVar81,0x84);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar35 = (auVar62 | auVar66 & auVar32) ^ auVar35;
      auVar32 = packssdw(auVar35,auVar35);
      auVar32 = packsswb(auVar32,auVar32);
      if ((auVar32._6_2_ >> 8 & 1) != 0) {
        cVar30 = '\0';
        if (uVar29 - 8 < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 8] = cVar30;
      }
      auVar32 = auVar48 ^ auVar24;
      auVar57._0_4_ = -(uint)(iVar41 < auVar32._0_4_);
      auVar57._4_4_ = -(uint)(iVar43 < auVar32._4_4_);
      auVar57._8_4_ = -(uint)(iVar64 < auVar32._8_4_);
      auVar57._12_4_ = -(uint)(iVar65 < auVar32._12_4_);
      auVar17._4_4_ = auVar57._0_4_;
      auVar17._0_4_ = auVar57._0_4_;
      auVar17._8_4_ = auVar57._8_4_;
      auVar17._12_4_ = auVar57._8_4_;
      auVar66 = pshuflw(auVar81,auVar17,0xe8);
      auVar36._0_4_ = -(uint)(auVar32._0_4_ == iVar41);
      auVar36._4_4_ = -(uint)(auVar32._4_4_ == iVar43);
      auVar36._8_4_ = -(uint)(auVar32._8_4_ == iVar64);
      auVar36._12_4_ = -(uint)(auVar32._12_4_ == iVar65);
      auVar73._4_4_ = auVar36._4_4_;
      auVar73._0_4_ = auVar36._4_4_;
      auVar73._8_4_ = auVar36._12_4_;
      auVar73._12_4_ = auVar36._12_4_;
      auVar32 = pshuflw(auVar36,auVar73,0xe8);
      auVar74._4_4_ = auVar57._4_4_;
      auVar74._0_4_ = auVar57._4_4_;
      auVar74._8_4_ = auVar57._12_4_;
      auVar74._12_4_ = auVar57._12_4_;
      auVar62 = pshuflw(auVar57,auVar74,0xe8);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar58 = (auVar62 | auVar32 & auVar66) ^ auVar58;
      auVar62 = packssdw(auVar58,auVar58);
      auVar32 = packsswb(auVar32 & auVar66,auVar62);
      if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        cVar30 = '\0';
        if (uVar29 - 7 < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 7] = cVar30;
      }
      auVar18._4_4_ = auVar57._0_4_;
      auVar18._0_4_ = auVar57._0_4_;
      auVar18._8_4_ = auVar57._8_4_;
      auVar18._12_4_ = auVar57._8_4_;
      auVar74 = auVar73 & auVar18 | auVar74;
      auVar62 = packssdw(auVar74,auVar74);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar62 = packssdw(auVar62 ^ auVar6,auVar62 ^ auVar6);
      auVar32 = packsswb(auVar32,auVar62);
      if ((auVar32._8_2_ >> 8 & 1) != 0) {
        cVar30 = '\0';
        if (uVar29 - 6 < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 6] = cVar30;
      }
      auVar32 = auVar47 ^ auVar24;
      auVar59._0_4_ = -(uint)(iVar41 < auVar32._0_4_);
      auVar59._4_4_ = -(uint)(iVar43 < auVar32._4_4_);
      auVar59._8_4_ = -(uint)(iVar64 < auVar32._8_4_);
      auVar59._12_4_ = -(uint)(iVar65 < auVar32._12_4_);
      auVar75._4_4_ = auVar59._0_4_;
      auVar75._0_4_ = auVar59._0_4_;
      auVar75._8_4_ = auVar59._8_4_;
      auVar75._12_4_ = auVar59._8_4_;
      iVar79 = -(uint)(auVar32._4_4_ == iVar43);
      iVar83 = -(uint)(auVar32._12_4_ == iVar65);
      auVar19._4_4_ = iVar79;
      auVar19._0_4_ = iVar79;
      auVar19._8_4_ = iVar83;
      auVar19._12_4_ = iVar83;
      auVar82._4_4_ = auVar59._4_4_;
      auVar82._0_4_ = auVar59._4_4_;
      auVar82._8_4_ = auVar59._12_4_;
      auVar82._12_4_ = auVar59._12_4_;
      auVar32 = auVar19 & auVar75 | auVar82;
      auVar32 = packssdw(auVar32,auVar32);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar32 = packssdw(auVar32 ^ auVar7,auVar32 ^ auVar7);
      auVar32 = packsswb(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        cVar30 = '\0';
        if (uVar29 - 5 < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 5] = cVar30;
      }
      auVar32 = pshufhw(auVar32,auVar75,0x84);
      auVar20._4_4_ = iVar79;
      auVar20._0_4_ = iVar79;
      auVar20._8_4_ = iVar83;
      auVar20._12_4_ = iVar83;
      auVar66 = pshufhw(auVar59,auVar20,0x84);
      auVar62 = pshufhw(auVar32,auVar82,0x84);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar37 = (auVar62 | auVar66 & auVar32) ^ auVar37;
      auVar32 = packssdw(auVar37,auVar37);
      auVar32 = packsswb(auVar32,auVar32);
      if ((auVar32._10_2_ >> 8 & 1) != 0) {
        cVar30 = '\0';
        if (uVar29 - 4 < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 4] = cVar30;
      }
      auVar32 = auVar46 ^ auVar24;
      auVar60._0_4_ = -(uint)(iVar41 < auVar32._0_4_);
      auVar60._4_4_ = -(uint)(iVar43 < auVar32._4_4_);
      auVar60._8_4_ = -(uint)(iVar64 < auVar32._8_4_);
      auVar60._12_4_ = -(uint)(iVar65 < auVar32._12_4_);
      auVar21._4_4_ = auVar60._0_4_;
      auVar21._0_4_ = auVar60._0_4_;
      auVar21._8_4_ = auVar60._8_4_;
      auVar21._12_4_ = auVar60._8_4_;
      auVar66 = pshuflw(auVar82,auVar21,0xe8);
      auVar38._0_4_ = -(uint)(auVar32._0_4_ == iVar41);
      auVar38._4_4_ = -(uint)(auVar32._4_4_ == iVar43);
      auVar38._8_4_ = -(uint)(auVar32._8_4_ == iVar64);
      auVar38._12_4_ = -(uint)(auVar32._12_4_ == iVar65);
      auVar76._4_4_ = auVar38._4_4_;
      auVar76._0_4_ = auVar38._4_4_;
      auVar76._8_4_ = auVar38._12_4_;
      auVar76._12_4_ = auVar38._12_4_;
      auVar32 = pshuflw(auVar38,auVar76,0xe8);
      auVar77._4_4_ = auVar60._4_4_;
      auVar77._0_4_ = auVar60._4_4_;
      auVar77._8_4_ = auVar60._12_4_;
      auVar77._12_4_ = auVar60._12_4_;
      auVar62 = pshuflw(auVar60,auVar77,0xe8);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar32 = packssdw(auVar32 & auVar66,(auVar62 | auVar32 & auVar66) ^ auVar8);
      auVar32 = packsswb(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        cVar30 = '\0';
        if (uVar29 - 3 < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 3] = cVar30;
      }
      auVar22._4_4_ = auVar60._0_4_;
      auVar22._0_4_ = auVar60._0_4_;
      auVar22._8_4_ = auVar60._8_4_;
      auVar22._12_4_ = auVar60._8_4_;
      auVar77 = auVar76 & auVar22 | auVar77;
      auVar62 = packssdw(auVar77,auVar77);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar32 = packssdw(auVar32,auVar62 ^ auVar9);
      auVar32 = packsswb(auVar32,auVar32);
      if ((auVar32._12_2_ >> 8 & 1) != 0) {
        cVar30 = '\0';
        if (uVar29 - 2 < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 2] = cVar30;
      }
      auVar32 = auVar44 ^ auVar24;
      auVar61._0_4_ = -(uint)(iVar41 < auVar32._0_4_);
      auVar61._4_4_ = -(uint)(iVar43 < auVar32._4_4_);
      auVar61._8_4_ = -(uint)(iVar64 < auVar32._8_4_);
      auVar61._12_4_ = -(uint)(iVar65 < auVar32._12_4_);
      auVar78._4_4_ = auVar61._0_4_;
      auVar78._0_4_ = auVar61._0_4_;
      auVar78._8_4_ = auVar61._8_4_;
      auVar78._12_4_ = auVar61._8_4_;
      iVar41 = -(uint)(auVar32._4_4_ == iVar43);
      iVar43 = -(uint)(auVar32._12_4_ == iVar65);
      auVar63._4_4_ = iVar41;
      auVar63._0_4_ = iVar41;
      auVar63._8_4_ = iVar43;
      auVar63._12_4_ = iVar43;
      auVar39._4_4_ = auVar61._4_4_;
      auVar39._0_4_ = auVar61._4_4_;
      auVar39._8_4_ = auVar61._12_4_;
      auVar39._12_4_ = auVar61._12_4_;
      auVar39 = auVar63 & auVar78 | auVar39;
      auVar32 = packssdw(auVar39,auVar39);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar32 = packssdw(auVar32 ^ auVar10,auVar32 ^ auVar10);
      auVar32 = packsswb(auVar32,auVar32);
      if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        cVar30 = '\0';
        if (uVar29 - 1 < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29 - 1] = cVar30;
      }
      auVar32 = pshufhw(auVar32,auVar78,0x84);
      in_XMM11 = pshufhw(auVar61,auVar63,0x84);
      in_XMM11 = in_XMM11 & auVar32;
      auVar23._4_4_ = auVar61._4_4_;
      auVar23._0_4_ = auVar61._4_4_;
      auVar23._8_4_ = auVar61._12_4_;
      auVar23._12_4_ = auVar61._12_4_;
      auVar32 = pshufhw(auVar32,auVar23,0x84);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar40 = (auVar32 | in_XMM11) ^ auVar40;
      auVar32 = packssdw(auVar40,auVar40);
      auVar32 = packsswb(auVar32,auVar32);
      if ((auVar32._14_2_ >> 8 & 1) != 0) {
        cVar30 = '\0';
        if (uVar29 < uVar27) {
          cVar30 = ch;
        }
        pcVar26[uVar29] = cVar30;
      }
      lVar28 = (long)DAT_00125920;
      lVar45 = auVar52._8_8_;
      auVar52._0_8_ = auVar52._0_8_ + lVar28;
      lVar42 = DAT_00125920._8_8_;
      auVar52._8_8_ = lVar45 + lVar42;
      lVar45 = auVar51._8_8_;
      auVar51._0_8_ = auVar51._0_8_ + lVar28;
      auVar51._8_8_ = lVar45 + lVar42;
      lVar45 = auVar50._8_8_;
      auVar50._0_8_ = auVar50._0_8_ + lVar28;
      auVar50._8_8_ = lVar45 + lVar42;
      lVar45 = auVar49._8_8_;
      auVar49._0_8_ = auVar49._0_8_ + lVar28;
      auVar49._8_8_ = lVar45 + lVar42;
      lVar45 = auVar48._8_8_;
      auVar48._0_8_ = auVar48._0_8_ + lVar28;
      auVar48._8_8_ = lVar45 + lVar42;
      lVar45 = auVar47._8_8_;
      auVar47._0_8_ = auVar47._0_8_ + lVar28;
      auVar47._8_8_ = lVar45 + lVar42;
      lVar45 = auVar46._8_8_;
      auVar46._0_8_ = auVar46._0_8_ + lVar28;
      auVar46._8_8_ = lVar45 + lVar42;
      lVar45 = auVar44._8_8_;
      auVar44._0_8_ = auVar44._0_8_ + lVar28;
      auVar44._8_8_ = lVar45 + lVar42;
      lVar28 = uVar29 - ((ulong)uVar1 + 0xf & 0xfffffffffffffff0);
      uVar29 = uVar29 + 0x10;
      auVar32 = _DAT_00125920;
    } while (lVar28 != -1);
  }
  return pcVar26;
}

Assistant:

char * create_by_char(char ch, int size)
{
    //  使用 new 创建指定长度字符串，最后一位填充为 '\0'
    char *str = new char[size + 1];
    for(int i = 0; i <= size; i++) {
        if (i < size) {
            // 每个字符指向的地址
            str[i] = ch;
        } else {
            str[i] = '\0';
        }
    }
    //  返回指针
    return str;
}